

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementShellReissner4::GetDensity(ChElementShellReissner4 *this)

{
  GetDensity((ChElementShellReissner4 *)
             (this[-1].stress_i[3].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
              m_storage.m_data.array + 10));
  return;
}

Assistant:

double ChElementShellReissner4::GetDensity() {
    double tot_density = 0;
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();
        double layerthick = m_layers[kl].Get_thickness();
        tot_density += rho * layerthick;
    }
    return tot_density / tot_thickness;
}